

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeadNode.h
# Opt level: O3

int __thiscall
duckdb_skiplistlib::skip_list::
HeadNode<std::pair<unsigned_long,_int>,_duckdb::SkipLess<std::pair<unsigned_long,_int>_>_>::remove
          (HeadNode<std::pair<unsigned_long,_int>,_duckdb::SkipLess<std::pair<unsigned_long,_int>_>_>
           *this,char *__filename)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  char *__filename_00;
  pair<unsigned_long,_int> pVar3;
  Node<std::pair<unsigned_long,_int>,_duckdb::SkipLess<std::pair<unsigned_long,_int>_>_> *pNode;
  
  lVar2 = (long)(this->_nodeRefs)._nodes.
                super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_int>,_duckdb::SkipLess<std::pair<unsigned_long,_int>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_int>,_duckdb::SkipLess<std::pair<unsigned_long,_int>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->_nodeRefs)._nodes.
                super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_int>,_duckdb::SkipLess<std::pair<unsigned_long,_int>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_int>,_duckdb::SkipLess<std::pair<unsigned_long,_int>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  __filename_00 = (char *)(lVar2 >> 4);
  do {
    __filename_00 = __filename_00 + -1;
    if (__filename_00 == (char *)0xffffffffffffffff) {
      _throwValueErrorNotFound(this,(pair<unsigned_long,_int> *)__filename);
      _adjRemoveRefs(this,_DAT_00000028,
                     (Node<std::pair<unsigned_long,_int>,_duckdb::SkipLess<std::pair<unsigned_long,_int>_>_>
                      *)0x0);
      this->_count = this->_count - 1;
      pNode = (Node<std::pair<unsigned_long,_int>,_duckdb::SkipLess<std::pair<unsigned_long,_int>_>_>
               *)0x0;
      goto LAB_019fd694;
    }
    iVar1 = Node<std::pair<unsigned_long,_int>,_duckdb::SkipLess<std::pair<unsigned_long,_int>_>_>::
            remove(*(Node<std::pair<unsigned_long,_int>,_duckdb::SkipLess<std::pair<unsigned_long,_int>_>_>
                     **)((long)&(this->_nodeRefs)._nodes.
                                super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_int>,_duckdb::SkipLess<std::pair<unsigned_long,_int>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_int>,_duckdb::SkipLess<std::pair<unsigned_long,_int>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].pNode + lVar2),
                   __filename_00);
    pNode = (Node<std::pair<unsigned_long,_int>,_duckdb::SkipLess<std::pair<unsigned_long,_int>_>_>
             *)CONCAT44(extraout_var,iVar1);
    lVar2 = lVar2 + -0x10;
  } while (pNode == (Node<std::pair<unsigned_long,_int>,_duckdb::SkipLess<std::pair<unsigned_long,_int>_>_>
                     *)0x0);
  _adjRemoveRefs(this,(pNode->_nodeRefs)._swapLevel,pNode);
  this->_count = this->_count - 1;
LAB_019fd694:
  pVar3 = Node<std::pair<unsigned_long,_int>,_duckdb::SkipLess<std::pair<unsigned_long,_int>_>_>::
          _Pool::Release(&this->_pool,pNode);
  return (int)pVar3.first;
}

Assistant:

T HeadNode<T, _Compare>::remove(const T &value) {
#ifdef SKIPLIST_THREAD_SUPPORT
    std::lock_guard<std::mutex> lock(gSkipListMutex);
#ifdef SKIPLIST_THREAD_SUPPORT_TRACE
    std::cout << "HeadNode remove() thread: " << std::this_thread::get_id() << std::endl;
#endif
#endif
    Node<T, _Compare> *pNode = nullptr;
    size_t level;

    _throwIfValueDoesNotCompare(value);
    for (level = _nodeRefs.height(); level-- > 0;) {
        assert(_nodeRefs[level].pNode);
        pNode = _nodeRefs[level].pNode->remove(level, value);
        if (pNode) {
            break;
        }
    }
    if (! pNode) {
        _throwValueErrorNotFound(value);
    }
    // Take swap level as some swaps will have been dealt with by the remove() above.
    _adjRemoveRefs(pNode->nodeRefs().swapLevel(), pNode);
    --_count;
    T ret_val = _pool.Release(pNode);
#ifdef SKIPLIST_THREAD_SUPPORT_TRACE
    std::cout << "HeadNode remove() thread: " << std::this_thread::get_id() << " DONE" << std::endl;
#endif
    return ret_val;
}